

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

Marray<float,_std::allocator<unsigned_long>_> * __thiscall
andres::Marray<float,_std::allocator<unsigned_long>_>::operator=
          (Marray<float,_std::allocator<unsigned_long>_> *this,
          Marray<float,_std::allocator<unsigned_long>_> *in)

{
  float *__dest;
  size_t sVar1;
  pointer __src;
  
  testInvariant(this);
  testInvariant(in);
  if (this != in) {
    __src = (in->super_View<float,_false,_std::allocator<unsigned_long>_>).data_;
    if (__src == (pointer)0x0) {
      operator_delete((this->super_View<float,_false,_std::allocator<unsigned_long>_>).data_,
                      (this->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_.
                      size_ << 2);
      (this->super_View<float,_false,_std::allocator<unsigned_long>_>).data_ = (pointer)0x0;
    }
    else {
      __dest = (this->super_View<float,_false,_std::allocator<unsigned_long>_>).data_;
      sVar1 = (this->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_.size_;
      if (sVar1 != (in->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_.size_) {
        operator_delete(__dest,sVar1 << 2);
        __dest = __gnu_cxx::new_allocator<float>::allocate
                           ((new_allocator<float> *)&this->field_0x40,
                            (in->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_
                            .size_,(void *)0x0);
        (this->super_View<float,_false,_std::allocator<unsigned_long>_>).data_ = __dest;
        __src = (in->super_View<float,_false,_std::allocator<unsigned_long>_>).data_;
        sVar1 = (in->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_.size_;
      }
      memcpy(__dest,__src,sVar1 << 2);
    }
    marray_detail::Geometry<std::allocator<unsigned_long>_>::operator=
              (&(this->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_,
               &(in->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_);
  }
  testInvariant(this);
  return this;
}

Assistant:

Marray<T, A>&
Marray<T, A>::operator=
(
    const Marray<T, A>& in
)
{
    testInvariant();
    if(!MARRAY_NO_ARG_TEST) {
        in.testInvariant();
    }
    if(this != &in) { // no self-assignment
        // copy data
        if(in.data_ == 0) { // un-initialized
            // free
            dataAllocator_.deallocate(this->data_, this->size());
            this->data_ = 0;
        }
        else {
            if(this->size() != in.size()) {
                // re-alloc
                dataAllocator_.deallocate(this->data_, this->size());
                this->data_ = dataAllocator_.allocate(in.size());
            }
            // copy data
            memcpy(this->data_, in.data_, in.size() * sizeof(T));
        }
        this->geometry_ = in.geometry_;
    }
    testInvariant();
    return *this;
}